

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O0

int domonnoise(monst *mtmp)

{
  boolean bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  obj *poVar5;
  trap *ptVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  permonst *local_228;
  int local_20c;
  permonst *local_200;
  char *local_1d0;
  char *local_1a8;
  char *local_190;
  char *local_188;
  bool local_171;
  long goffer;
  long gdemand;
  trap *t;
  int vampindex;
  char *racenoun;
  undefined1 local_138;
  boolean nightchild;
  boolean kindred;
  boolean isnight;
  int mndx;
  char verbuf [256];
  permonst *local_30;
  permonst *ptr;
  char *verbl_msg;
  char *pline_msg;
  monst *mtmp_local;
  
  verbl_msg = (char *)0x0;
  ptr = (permonst *)0x0;
  local_30 = mtmp->data;
  if (flags.soundok == '\0') {
    return 0;
  }
  if (local_30->msound == '\0') {
    return 0;
  }
  if ((local_30->msound == '!') && (local_30 != &pm_guardian)) {
    iVar3 = monsndx(local_30);
    iVar3 = genus(iVar3,1);
    local_30 = mons + iVar3;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
        (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))))))
    goto LAB_002d9667;
LAB_002d96f4:
    if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
         ((poVar5 = which_armor(mtmp,4), poVar5 != (obj *)0x0 &&
          (poVar5 = which_armor(mtmp,4), poVar5->otyp == 0x4f)))) ||
        ((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))) ||
           (u.uprops[0x19].blocked != 0)))) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0')))) {
      map_invisible(mtmp->mx,mtmp->my);
    }
  }
  else {
    bVar1 = worm_known(level,mtmp);
    if (bVar1 == '\0') goto LAB_002d96f4;
LAB_002d9667:
    if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
         (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
       ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)
         ) || (((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_002d96f4;
  }
  switch(local_30->msound) {
  case '\x01':
    if ((flags.moonphase == 4) && (iVar3 = night(), iVar3 != 0)) {
      verbl_msg = "howls.";
    }
    else if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      verbl_msg = "growls.";
    }
    else if ((mtmp->mtame == '\0') ||
            ((((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) == 0 &&
              ((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) == 0)) &&
             (((*(uint *)&mtmp->field_0x60 >> 0x17 & 1) == 0 &&
              ((moves <= *(uint *)((long)&mtmp[1].data + 4) && ('\x04' < mtmp->mtame)))))))) {
      if ((mtmp->mtame == '\0') || (*(uint *)((long)&mtmp[1].data + 4) <= moves + 1000)) {
        if (mtmp->data != mons + 0x15) {
          verbl_msg = "barks.";
        }
      }
      else {
        verbl_msg = "yips.";
      }
    }
    else {
      verbl_msg = "whines.";
    }
    break;
  case '\x02':
    if (mtmp->mtame != '\0') {
      if (((((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) == 0) &&
           ((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) == 0)) &&
          ((*(uint *)&mtmp->field_0x60 >> 0x17 & 1) == 0)) && ('\x04' < mtmp->mtame)) {
        if (*(uint *)((long)&mtmp[1].data + 4) < moves) {
          verbl_msg = "meows.";
        }
        else if (moves + 1000 < *(uint *)((long)&mtmp[1].data + 4)) {
          verbl_msg = "purrs.";
        }
        else {
          verbl_msg = "mews.";
        }
      }
      else {
        verbl_msg = "yowls.";
      }
      break;
    }
  case '\x04':
    if ((mtmp->mtame == '\0') ||
       (((mtmp->data != mons + 0xef && (mtmp->data != mons + 0xf0)) && (mtmp->data != mons + 0xf3)))
       ) {
      verbl_msg = "growls!";
      if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) {
        verbl_msg = "snarls.";
      }
    }
    else if ((((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) == 0) &&
             ((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) == 0)) &&
            (((*(uint *)&mtmp->field_0x60 >> 0x17 & 1) == 0 &&
             ((moves <= *(uint *)((long)&mtmp[1].data + 4) && ('\x04' < mtmp->mtame)))))) {
      if (moves + 1000 < *(uint *)((long)&mtmp[1].data + 4)) {
        verbl_msg = "chatters.";
      }
      else {
        verbl_msg = "hoots.";
      }
    }
    else {
      verbl_msg = "shrieks.";
      wake_nearto((int)mtmp->mx,(int)mtmp->my,0x40);
    }
    break;
  case '\x03':
    verbl_msg = "roars!";
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) {
      verbl_msg = "snarls.";
    }
    break;
  case '\x05':
    verbl_msg = "squeaks.";
    break;
  case '\x06':
    if ((local_30 == mons + 0x84) && ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0)) {
      ptr = (permonst *)anon_var_dwarf_a55ab;
    }
    else {
      verbl_msg = "squawks.";
    }
    break;
  case '\a':
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) {
      return 0;
    }
    verbl_msg = "hisses!";
    break;
  case '\b':
    verbl_msg = "buzzes angrily.";
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) {
      verbl_msg = "drones.";
    }
    break;
  case '\t':
    verbl_msg = "grunts.";
    break;
  case '\n':
    if (mtmp->mtame < '\x05') {
      verbl_msg = "neighs.";
    }
    else if (*(uint *)((long)&mtmp[1].data + 4) < moves) {
      verbl_msg = "whinnies.";
    }
    else {
      verbl_msg = "whickers.";
    }
    break;
  case '\v':
    verbl_msg = "wails mournfully.";
    break;
  case '\f':
    verbl_msg = "gurgles.";
    break;
  case '\r':
    verbl_msg = "burbles.";
    break;
  case '\x0f':
    verbl_msg = "shrieks.";
    aggravate();
    break;
  case '\x10':
    pcVar9 = Monnam(mtmp);
    pline("%s rattles noisily.",pcVar9);
    pline("You freeze for a moment.");
    nomul(-2,"scared by rattling");
    break;
  case '\x11':
    iVar3 = rn2(4);
    verbl_msg = domonnoise::laugh_msg[iVar3];
    break;
  case '\x12':
    verbl_msg = "mumbles incomprehensibly.";
    break;
  case '\x13':
    verbl_msg = "imitates you.";
    break;
  case '\x15':
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      iVar3 = rn2(3);
      ptr = (permonst *)domonnoise::arrest_msg[iVar3];
    }
    else {
      pcVar9 = "Sir";
      if (flags.female != '\0') {
        pcVar9 = "Ma\'am";
      }
      verbalize("Just the facts, %s.",pcVar9);
    }
    break;
  case '\x16':
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      iVar3 = rn2(3);
      local_228 = (permonst *)domonnoise::soldier_foe_msg[iVar3];
    }
    else {
      iVar3 = rn2(3);
      local_228 = (permonst *)domonnoise::soldier_pax_msg[iVar3];
    }
    ptr = local_228;
    break;
  case '\x17':
    lVar7 = money_cnt(invent);
    if (lVar7 == 0) {
      ptr = (permonst *)anon_var_dwarf_a58b7;
    }
    else {
      ptr = (permonst *)anon_var_dwarf_a58ab;
    }
    break;
  case '\x18':
    if (mtmp->mtame == '\0') {
      if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
        ptr = (permonst *)anon_var_dwarf_a56bf;
      }
      else if (local_30 == mons + 300) {
        verbl_msg = "gurgles.";
      }
      else {
        ptr = (permonst *)anon_var_dwarf_a56b3;
      }
    }
    else {
      ptr = (permonst *)anon_var_dwarf_a56a7;
    }
    break;
  case '\x19':
    if ((uwep == (obj *)0x0) ||
       ((uwep->oclass != '\x02' &&
        ((uwep->oclass != '\x06' || (objects[uwep->otyp].oc_subtyp == '\0')))))) {
      if ((uarmc == (obj *)0x0) &&
         (((uarm == (obj *)0x0 && (uarmh == (obj *)0x0)) &&
          ((uarms == (obj *)0x0 && ((uarmg == (obj *)0x0 && (uarmf == (obj *)0x0)))))))) {
        if (uarmu == (obj *)0x0) {
          ptr = (permonst *)anon_var_dwarf_a589f;
        }
        else {
          ptr = (permonst *)anon_var_dwarf_a5893;
        }
      }
      else {
        ptr = (permonst *)"Please undress so I can examine you.";
        if (urole.malenum == 0x15e) {
          ptr = (permonst *)"Doc, I can\'t help you unless you cooperate.";
        }
      }
    }
    else {
      ptr = (permonst *)anon_var_dwarf_a586f;
    }
    break;
  case '\x1a':
    if (((local_30->mlet == '\x0e') || (flags.seduce_enabled == '\0')) ||
       (iVar3 = could_seduce(mtmp,&youmonst,(attack *)0x0), iVar3 != 1)) {
      uVar4 = poly_gender();
      if (uVar4 == (*(uint *)&mtmp->field_0x60 & 1)) {
        local_20c = 0;
      }
      else {
        local_20c = rn2(3);
      }
      if (local_20c == 1) {
        verbl_msg = "comes on to you.";
      }
      else if (local_20c == 2) {
        ptr = (permonst *)anon_var_dwarf_a57c7;
      }
      else {
        verbl_msg = "cajoles you.";
      }
    }
    else {
      doseduce(mtmp);
    }
    break;
  case '\x1b':
    iVar3 = night();
    cVar2 = (char)iVar3;
    if (u.umonnum == u.umonster) {
      local_171 = urace.malenum == 0xe8;
    }
    else {
      local_171 = u.umonnum == 0xe8 || u.umonnum == 0xe9;
    }
    bVar11 = false;
    if (((u.umonnum != u.umonster) && (bVar11 = true, u.umonnum != 0x16)) &&
       (bVar11 = true, u.umonnum != 0x1a)) {
      bVar11 = u.umonnum == 0x19;
    }
    if ((flags.female == '\0') || (urace.individual.f == (char *)0x0)) {
      if (urace.individual.m == (char *)0x0) {
        local_190 = urace.noun;
      }
      else {
        local_190 = urace.individual.m;
      }
      local_188 = local_190;
    }
    else {
      local_188 = urace.individual.f;
    }
    if (mtmp->mtame == '\0') {
      if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
        if (local_171) {
          ptr = (permonst *)anon_var_dwarf_a544f;
        }
        else if ((youmonst.data == mons + 0x94) || (youmonst.data == mons + 0x8a)) {
          pcVar9 = "Young Fool";
          if (youmonst.data == mons + 0x94) {
            pcVar9 = "Fool";
          }
          sprintf(&local_138,"%s! Your silver sheen does not frighten me!",pcVar9);
          ptr = (permonst *)&local_138;
        }
        else {
          iVar3 = rn2(2);
          if (iVar3 == 0) {
            pcVar9 = body_part(0xf);
            sprintf(&local_138,"I vant to suck your %s!",pcVar9);
            ptr = (permonst *)&local_138;
          }
          else if (iVar3 == 1) {
            if (u.umonnum == u.umonster) {
              local_1d0 = an(local_188);
            }
            else {
              pcVar9 = mons_mname(mons + u.umonnum);
              local_1d0 = an(pcVar9);
            }
            sprintf(&local_138,"I vill come after %s without regret!",local_1d0);
            ptr = (permonst *)&local_138;
          }
          else {
            ptr = (permonst *)domonnoise::vampmsg[iVar3];
          }
        }
      }
      else if ((local_171) && (cVar2 != '\0')) {
        pcVar9 = "brother";
        if (flags.female != '\0') {
          pcVar9 = "sister";
        }
        sprintf(&local_138,"Good feeding %s!",pcVar9);
        ptr = (permonst *)&local_138;
      }
      else if ((bVar11) && (cVar2 != '\0')) {
        sprintf(&local_138,"How nice to hear you, child of the night!");
        ptr = (permonst *)&local_138;
      }
      else {
        ptr = (permonst *)anon_var_dwarf_a52d8;
      }
    }
    else {
      if (local_171) {
        pcVar9 = "day";
        if (cVar2 != '\0') {
          pcVar9 = "evening";
        }
        pcVar10 = ".  Why do we not rest?";
        if (cVar2 != '\0') {
          pcVar10 = "!";
        }
        sprintf(&local_138,"Good %s to you Master%s",pcVar9,pcVar10);
      }
      else {
        pcVar9 = "";
        if (bVar11) {
          pcVar9 = "Child of the night, ";
        }
        iVar3 = midnight();
        if (iVar3 == 0) {
          local_1a8 = "I find myself growing a little weary.";
          if (cVar2 != '\0') {
            local_1a8 = "I beg you, help me satisfy this growing craving!";
          }
        }
        else {
          local_1a8 = "I can stand this craving no longer!";
        }
        sprintf(&local_138,"%s%s",pcVar9,local_1a8);
      }
      ptr = (permonst *)&local_138;
    }
    break;
  case '\x1c':
    iVar3 = monsndx(local_30);
    if (iVar3 == 0x10d) {
      lVar7 = (long)(u.ulevel * 500);
      if (((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) && (mtmp->mtame == '\0')) {
        pcVar9 = Amonnam(mtmp);
        pcVar10 = currency(lVar7);
        pline("%s demands %ld %s to avoid re-arrest.",pcVar9,lVar7,pcVar10);
        lVar8 = bribe(mtmp);
        if (lVar8 < lVar7) {
          verbalize("I said %ld!",lVar7);
          mtmp->mspec_used = 1000;
        }
        else {
          ptr = (permonst *)anon_var_dwarf_686a9;
          *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff | 0x400000;
          set_malign(mtmp);
        }
      }
      else {
        ptr = (permonst *)anon_var_dwarf_9ce20;
      }
      break;
    }
    if (((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) && (mtmp->mtame == '\0')) {
      demon_talk(mtmp);
      break;
    }
  case '\x1d':
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      cuss(mtmp);
    }
    break;
  case '\x1e':
    if ((local_30 == mons + 0x144) && (iVar3 = rn2(10), iVar3 == 0)) {
      verbl_msg = "is busy reading a copy of Sandman #8.";
    }
    else {
      ptr = (permonst *)"Who do you think you are, War?";
      if (local_30 == mons + 0x144) {
        ptr = (permonst *)"WHO DO YOU THINK YOU ARE, WAR?";
      }
    }
    break;
  case '\x1f':
  case ' ':
  case '!':
    quest_chat(mtmp);
    break;
  case '\"':
    shk_chat(mtmp);
    break;
  case '#':
    iVar3 = doconsult(mtmp);
    return iVar3;
  case '$':
    priest_talk(mtmp);
    break;
  case '%':
    verbl_msg = "seems to mutter a cantrip.";
    break;
  case '&':
    if (flags.moonphase == 4) {
      uVar4 = night();
      iVar3 = rn2(0xd);
      if (uVar4 != ((iVar3 != 0 ^ 0xffU) & 1)) {
        pcVar9 = Monnam(mtmp);
        iVar3 = pronoun_gender(level,mtmp);
        pcVar10 = "howl";
        if (local_30 == mons + 0x10e) {
          pcVar10 = "shriek";
        }
        pline("%s throws back %s head and lets out a blood curdling %s!",pcVar9,genders[iVar3].his,
              pcVar10);
        wake_nearto((int)mtmp->mx,(int)mtmp->my,0x79);
        break;
      }
    }
    verbl_msg = "whispers inaudibly.  All you can make out is \"moon\".";
    break;
  case '\'':
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      iVar3 = rn2(4);
      if (iVar3 == 0) {
        pcVar9 = Monnam(mtmp);
        iVar3 = pronoun_gender(level,mtmp);
        pline("%s boasts about %s gem collection.",pcVar9,genders[iVar3].his);
      }
      else if (iVar3 == 1) {
        verbl_msg = "complains about a diet of mutton.";
      }
      else {
        verbl_msg = "shouts \"Fee Fie Foe Foo!\" and guffaws.";
        wake_nearto((int)mtmp->mx,(int)mtmp->my,0x31);
      }
      break;
    }
  case '\x14':
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      if (((u.uz.dnum != dungeon_topology.d_astral_level.dnum) || (local_30 < mons + 0x159)) ||
         (mons + 0x168 < local_30)) {
        return 0;
      }
      mplayer_talk(mtmp);
    }
    else if ((*(uint *)&mtmp->field_0x60 >> 0x10 & 1) == 0) {
      if (mtmp->mhp < mtmp->mhpmax / 4) {
        verbl_msg = "moans.";
      }
      else if (((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) == 0) &&
              ((*(uint *)&mtmp->field_0x60 >> 0x14 & 1) == 0)) {
        if ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) == 0) {
          ptr = (permonst *)anon_var_dwarf_a572b;
        }
        else if ((*(uint *)&mtmp->field_0x60 >> 0x17 & 1) == 0) {
          if (mtmp->mhp < mtmp->mhpmax / 2) {
            verbl_msg = "asks for a potion of healing.";
          }
          else if (((mtmp->mtame == '\0') || ((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) != 0)) ||
                  (moves <= *(uint *)((long)&mtmp[1].data + 4))) {
            if ((local_30->mflags2 & 0x10) == 0) {
              if ((local_30->mflags2 & 0x20) == 0) {
                if ((local_30->mflags2 & 0x80000000) == 0) {
                  if (local_30->mlet == '\x1d') {
                    verbl_msg = "discusses hunting.";
                  }
                  else {
                    iVar3 = monsndx(local_30);
                    if (iVar3 == 0x2c) {
                      verbl_msg = "asks you about the One Ring.";
                      if (9 < mtmp->mhpmax - mtmp->mhp) {
                        verbl_msg = "complains about unpleasant dungeon conditions.";
                      }
                    }
                    else if (iVar3 == 0x159) {
                      verbl_msg = "describes a recent article in \"Spelunker Today\" magazine.";
                    }
                    else if (iVar3 == 0x166) {
                      ptr = (permonst *)anon_var_dwarf_a57af;
                    }
                    else {
                      verbl_msg = "discusses dungeon exploration.";
                    }
                  }
                }
                else {
                  verbl_msg = "talks about spellcraft.";
                }
              }
              else {
                verbl_msg = "talks about mining.";
              }
            }
            else {
              verbl_msg = "curses orcs.";
            }
          }
          else {
            ptr = (permonst *)anon_var_dwarf_a5046;
          }
        }
        else {
          ptVar6 = t_at(level,(int)mtmp->mx,(int)mtmp->my);
          if (ptVar6 != (trap *)0x0) {
            ptVar6->field_0x8 = ptVar6->field_0x8 & 0xdf | 0x20;
          }
          ptr = (permonst *)anon_var_dwarf_a5737;
        }
      }
      else {
        iVar3 = rn2(3);
        if (iVar3 == 0) {
          local_200 = (permonst *)0x38e5dc;
        }
        else {
          iVar3 = rn2(2);
          local_200 = (permonst *)0x38e5e7;
          if (iVar3 != 0) {
            local_200 = (permonst *)0x38e5e1;
          }
        }
        ptr = local_200;
      }
    }
    else {
      verbl_msg = "wants nothing to do with you.";
    }
  }
  if (verbl_msg == (char *)0x0) {
    if (ptr != (permonst *)0x0) {
      verbalize((char *)ptr);
    }
  }
  else {
    pcVar9 = Monnam(mtmp);
    pline("%s %s",pcVar9,verbl_msg);
  }
  return 1;
}

Assistant:

static int domonnoise(struct monst *mtmp)
{
    const char *pline_msg = 0,	/* Monnam(mtmp) will be prepended */
			*verbl_msg = 0;	/* verbalize() */
    const struct permonst *ptr = mtmp->data;
    char verbuf[BUFSZ];

    /* presumably nearness and sleep checks have already been made */
    if (!flags.soundok) return 0;
    if (is_silent(ptr)) return 0;

    /* Make sure its your role's quest quardian; adjust if not */
    if (ptr->msound == MS_GUARDIAN && ptr != &pm_guardian) {
	int mndx = monsndx(ptr);
	ptr = &mons[genus(mndx,1)];
    }

    /* be sure to do this before talking; the monster might teleport away, in
     * which case we want to check its pre-teleport position
     */
    if (!canspotmon(level, mtmp))
	map_invisible(mtmp->mx, mtmp->my);

    switch (ptr->msound) {
	case MS_ORACLE:
	    return doconsult(mtmp);
	case MS_PRIEST:
	    priest_talk(mtmp);
	    break;
	case MS_LEADER:
	case MS_NEMESIS:
	case MS_GUARDIAN:
	    quest_chat(mtmp);
	    break;
	case MS_SELL: /* pitch, pay, total */
	    shk_chat(mtmp);
	    break;
	case MS_VAMPIRE:
	    {
	    /* vampire messages are varied by tameness, peacefulness, and time of night */
		boolean isnight = night();
		boolean kindred = maybe_polyd(u.umonnum == PM_VAMPIRE ||
					      u.umonnum == PM_VAMPIRE_LORD,
					      Race_if(PM_VAMPIRE));
		boolean nightchild = (Upolyd && (u.umonnum == PM_WOLF ||
				       u.umonnum == PM_WINTER_WOLF ||
				       u.umonnum == PM_WINTER_WOLF_CUB));
		const char *racenoun = (flags.female && urace.individual.f) ?
					urace.individual.f : (urace.individual.m) ?
					urace.individual.m : urace.noun;

		if (mtmp->mtame) {
			if (kindred) {
				sprintf(verbuf, "Good %s to you Master%s",
					isnight ? "evening" : "day",
					isnight ? "!" : ".  Why do we not rest?");
				verbl_msg = verbuf;
		    	} else {
		    	    sprintf(verbuf,"%s%s",
				nightchild ? "Child of the night, " : "",
				midnight() ?
					"I can stand this craving no longer!" :
				isnight ?
					"I beg you, help me satisfy this growing craving!" :
					"I find myself growing a little weary.");
				verbl_msg = verbuf;
			}
		} else if (mtmp->mpeaceful) {
			if (kindred && isnight) {
				sprintf(verbuf, "Good feeding %s!",
	    				flags.female ? "sister" : "brother");
				verbl_msg = verbuf;
 			} else if (nightchild && isnight) {
				sprintf(verbuf,
				    "How nice to hear you, child of the night!");
				verbl_msg = verbuf;
	    		} else
		    		verbl_msg = "I only drink... potions.";
    	        } else {
			int vampindex;
	    		static const char * const vampmsg[] = {
			       /* These first two (0 and 1) are specially handled below */
	    			"I vant to suck your %s!",
	    			"I vill come after %s without regret!",
		    	       /* other famous vampire quotes can follow here if desired */
	    		};
			if (kindred)
			    verbl_msg = "This is my hunting ground that you dare to prowl!";
			else if (youmonst.data == &mons[PM_SILVER_DRAGON] ||
				 youmonst.data == &mons[PM_BABY_SILVER_DRAGON]) {
			    /* Silver dragons are silver in color, not made of silver */
			    sprintf(verbuf, "%s! Your silver sheen does not frighten me!",
					youmonst.data == &mons[PM_SILVER_DRAGON] ?
					"Fool" : "Young Fool");
			    verbl_msg = verbuf; 
			} else {
			    vampindex = rn2(SIZE(vampmsg));
			    if (vampindex == 0) {
				sprintf(verbuf, vampmsg[vampindex], body_part(BLOOD));
	    			verbl_msg = verbuf;
			    } else if (vampindex == 1) {
				sprintf(verbuf, vampmsg[vampindex],
					Upolyd ? an(mons_mname(&mons[u.umonnum])) : an(racenoun));
	    			verbl_msg = verbuf;
		    	    } else
			    	verbl_msg = vampmsg[vampindex];
			}
	        }
	    }
	    break;
	case MS_WERE:
	    if (flags.moonphase == FULL_MOON && (night() ^ !rn2(13))) {
		pline("%s throws back %s head and lets out a blood curdling %s!",
		      Monnam(mtmp), mhis(level, mtmp),
		      ptr == &mons[PM_HUMAN_WERERAT] ? "shriek" : "howl");
		wake_nearto(mtmp->mx, mtmp->my, 11*11);
	    } else
		pline_msg =
		     "whispers inaudibly.  All you can make out is \"moon\".";
	    break;
	case MS_BARK:
	    if (flags.moonphase == FULL_MOON && night()) {
		pline_msg = "howls.";
	    } else if (mtmp->mpeaceful) {
		if (mtmp->mtame &&
			(mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
			 moves > EDOG(mtmp)->hungrytime || mtmp->mtame < 5))
		    pline_msg = "whines.";
		else if (mtmp->mtame && EDOG(mtmp)->hungrytime > moves + 1000)
		    pline_msg = "yips.";
		else {
		    if (mtmp->data != &mons[PM_DINGO])	/* dingos do not actually bark */
			    pline_msg = "barks.";
		}
	    } else {
		pline_msg = "growls.";
	    }
	    break;
	case MS_MEW:
	    if (mtmp->mtame) {
		if (mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
			mtmp->mtame < 5)
		    pline_msg = "yowls.";
		else if (moves > EDOG(mtmp)->hungrytime)
		    pline_msg = "meows.";
		else if (EDOG(mtmp)->hungrytime > moves + 1000)
		    pline_msg = "purrs.";
		else
		    pline_msg = "mews.";
		break;
	    } /* else FALLTHRU */
	case MS_GROWL:
	    if (mtmp->mtame &&
		(mtmp->data == &mons[PM_MONKEY] ||
		 mtmp->data == &mons[PM_APE] ||
		 mtmp->data == &mons[PM_CARNIVOROUS_APE])) {
		if (mtmp->mconf || mtmp->mflee || mtmp->mtrapped ||
		    moves > EDOG(mtmp)->hungrytime || mtmp->mtame < 5) {
		    pline_msg = "shrieks.";
		    wake_nearto(mtmp->mx, mtmp->my, 8*8);
		} else if (EDOG(mtmp)->hungrytime > moves + 1000) {
		    pline_msg = "chatters.";
		} else {
		    pline_msg = "hoots.";
		}
	    } else {
		pline_msg = mtmp->mpeaceful ? "snarls." : "growls!";
	    }
	    break;
	case MS_ROAR:
	    pline_msg = mtmp->mpeaceful ? "snarls." : "roars!";
	    break;
	case MS_SQEEK:
	    pline_msg = "squeaks.";
	    break;
	case MS_SQAWK:
	    if (ptr == &mons[PM_RAVEN] && !mtmp->mpeaceful)
	    	verbl_msg = "Nevermore!";
	    else
	    	pline_msg = "squawks.";
	    break;
	case MS_HISS:
	    if (!mtmp->mpeaceful)
		pline_msg = "hisses!";
	    else return 0;	/* no sound */
	    break;
	case MS_BUZZ:
	    pline_msg = mtmp->mpeaceful ? "drones." : "buzzes angrily.";
	    break;
	case MS_GRUNT:
	    pline_msg = "grunts.";
	    break;
	case MS_NEIGH:
	    if (mtmp->mtame < 5)
		pline_msg = "neighs.";
	    else if (moves > EDOG(mtmp)->hungrytime)
		pline_msg = "whinnies.";
	    else
		pline_msg = "whickers.";
	    break;
	case MS_WAIL:
	    pline_msg = "wails mournfully.";
	    break;
	case MS_GURGLE:
	    pline_msg = "gurgles.";
	    break;
	case MS_BURBLE:
	    pline_msg = "burbles.";
	    break;
	case MS_SHRIEK:
	    pline_msg = "shrieks.";
	    aggravate();
	    break;
	case MS_IMITATE:
	    pline_msg = "imitates you.";
	    break;
	case MS_BONES:
	    pline("%s rattles noisily.", Monnam(mtmp));
	    pline("You freeze for a moment.");
	    nomul(-2, "scared by rattling");
	    break;
	case MS_LAUGH:
	    {
		static const char * const laugh_msg[4] = {
		    "giggles.", "chuckles.", "snickers.", "laughs.",
		};
		pline_msg = laugh_msg[rn2(4)];
	    }
	    break;
	case MS_MUMBLE:
	    pline_msg = "mumbles incomprehensibly.";
	    break;
	case MS_DJINNI:
	    if (mtmp->mtame) {
		verbl_msg = "Sorry, I'm all out of wishes.";
	    } else if (mtmp->mpeaceful) {
		if (ptr == &mons[PM_WATER_DEMON])
		    pline_msg = "gurgles.";
		else
		    verbl_msg = "I'm free!";
	    } else verbl_msg = "This will teach you not to disturb me!";
	    break;
	case MS_BOAST:	/* giants */
	    if (!mtmp->mpeaceful) {
		switch (rn2(4)) {
		case 0: pline("%s boasts about %s gem collection.",
			      Monnam(mtmp), mhis(level, mtmp));
			break;
		case 1: pline_msg = "complains about a diet of mutton.";
			break;
	       default: pline_msg = "shouts \"Fee Fie Foe Foo!\" and guffaws.";
			wake_nearto(mtmp->mx, mtmp->my, 7*7);
			break;
		}
		break;
	    }
	    /* else FALLTHRU */
	case MS_HUMANOID:
	    if (!mtmp->mpeaceful) {
		if (In_endgame(&u.uz) && is_mplayer(ptr)) {
		    mplayer_talk(mtmp);
		    break;
		} else return 0;	/* no sound */
	    }
	    /* Generic peaceful humanoid behaviour. */
	    if (mtmp->mflee)
		pline_msg = "wants nothing to do with you.";
	    else if (mtmp->mhp < mtmp->mhpmax/4)
		pline_msg = "moans.";
	    else if (mtmp->mconf || mtmp->mstun)
		verbl_msg = !rn2(3) ? "Huh?" : rn2(2) ? "What?" : "Eh?";
	    else if (!mtmp->mcansee)
		verbl_msg = "I can't see!";
	    else if (mtmp->mtrapped) {
		struct trap *t = t_at(level, mtmp->mx, mtmp->my);

		if (t) t->tseen = 1;
		verbl_msg = "I'm trapped!";
	    } else if (mtmp->mhp < mtmp->mhpmax/2)
		pline_msg = "asks for a potion of healing.";
	    else if (mtmp->mtame && !mtmp->isminion &&
						moves > EDOG(mtmp)->hungrytime)
		verbl_msg = "I'm hungry.";
	    /* Specific monsters' interests */
	    else if (is_elf(ptr))
		pline_msg = "curses orcs.";
	    else if (is_dwarf(ptr))
		pline_msg = "talks about mining.";
	    else if (likes_magic(ptr))
		pline_msg = "talks about spellcraft.";
	    else if (ptr->mlet == S_CENTAUR)
		pline_msg = "discusses hunting.";
	    else switch (monsndx(ptr)) {
		case PM_HOBBIT:
		    pline_msg = (mtmp->mhpmax - mtmp->mhp >= 10) ?
				"complains about unpleasant dungeon conditions."
				: "asks you about the One Ring.";
		    break;
		case PM_ARCHEOLOGIST:
    pline_msg = "describes a recent article in \"Spelunker Today\" magazine.";
		    break;
		case PM_TOURIST:
		    verbl_msg = "Aloha.";
		    break;
		default:
		    pline_msg = "discusses dungeon exploration.";
		    break;
	    }
	    break;
	case MS_SEDUCE:
	    if (ptr->mlet != S_NYMPH && flags.seduce_enabled &&
		could_seduce(mtmp, &youmonst, NULL) == 1) {
			doseduce(mtmp);
			break;
	    }
	    
	    switch ((poly_gender() != (int) mtmp->female) ? rn2(3) : 0)
	    {
		case 2:
			verbl_msg = "Hello, sailor.";
			break;
		case 1:
			pline_msg = "comes on to you.";
			break;
		default:
			pline_msg = "cajoles you.";
	    }
	    break;
	case MS_ARREST:
	    if (mtmp->mpeaceful)
		verbalize("Just the facts, %s.",
		      flags.female ? "Ma'am" : "Sir");
	    else {
		static const char * const arrest_msg[3] = {
		    "Anything you say can be used against you.",
		    "You're under arrest!",
		    "Stop in the name of the Law!",
		};
		verbl_msg = arrest_msg[rn2(3)];
	    }
	    break;
	case MS_BRIBE:
	    if (monsndx(ptr) == PM_PRISON_GUARD) {
		long gdemand = 500 * u.ulevel;
		long goffer = 0;

		if (!mtmp->mpeaceful && !mtmp->mtame) {
		    pline("%s demands %ld %s to avoid re-arrest.",
			  Amonnam(mtmp), gdemand, currency(gdemand));
		    if ((goffer = bribe(mtmp)) >= gdemand) {
			verbl_msg = "Good.  Now beat it, scum!";
			mtmp->mpeaceful = 1;
			set_malign(mtmp);
		    } else {
			verbalize("I said %ld!", gdemand);
			mtmp->mspec_used = 1000;
		    }
		} else {
		    verbl_msg = "Out of my way, scum!"; /* still a jerk */
		}
		break;
	    } else if (mtmp->mpeaceful && !mtmp->mtame) {
		demon_talk(mtmp);
		break;
	    }
	    /* fall through */
	case MS_CUSS:
	    if (!mtmp->mpeaceful)
		cuss(mtmp);
	    break;
	case MS_SPELL:
	    /* deliberately vague, since it's not actually casting any spell */
	    pline_msg = "seems to mutter a cantrip.";
	    break;
	case MS_NURSE:
	    if (uwep && (uwep->oclass == WEAPON_CLASS || is_weptool(uwep)))
		verbl_msg = "Put that weapon away before you hurt someone!";
	    else if (uarmc || uarm || uarmh || uarms || uarmg || uarmf)
		verbl_msg = Role_if (PM_HEALER) ?
			  "Doc, I can't help you unless you cooperate." :
			  "Please undress so I can examine you.";
	    else if (uarmu)
		verbl_msg = "Take off your shirt, please.";
	    else
		verbl_msg = "Relax, this won't hurt a bit.";
	    break;
	case MS_GUARD:
	    if (money_cnt(invent))
		verbl_msg = "Please drop that gold and follow me.";
	    else
		verbl_msg = "Please follow me.";
	    break;
	case MS_SOLDIER:
	    {
		static const char * const soldier_foe_msg[3] = {
		    "Resistance is useless!",
		    "You're dog meat!",
		    "Surrender!",
		},		  * const soldier_pax_msg[3] = {
		    "What lousy pay we're getting here!",
		    "The food's not fit for Orcs!",
		    "My feet hurt, I've been on them all day!",
		};
		verbl_msg = mtmp->mpeaceful ? soldier_pax_msg[rn2(3)]
					    : soldier_foe_msg[rn2(3)];
	    }
	    break;
	case MS_RIDER:
	    if (ptr == &mons[PM_DEATH] && !rn2(10))
		pline_msg = "is busy reading a copy of Sandman #8.";
	    else
		verbl_msg = (ptr == &mons[PM_DEATH]) ?
			 "WHO DO YOU THINK YOU ARE, WAR?" :
			 "Who do you think you are, War?";
	    break;
    }

    if (pline_msg) pline("%s %s", Monnam(mtmp), pline_msg);
    else if (verbl_msg) verbalize(verbl_msg);
    return 1;
}